

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamcharsource.h
# Opt level: O0

StreamCharSource __thiscall YAML::StreamCharSource::operator+(StreamCharSource *this,int i)

{
  StreamCharSource SVar1;
  int i_local;
  StreamCharSource *this_local;
  StreamCharSource source;
  
  if ((int)this->m_offset + i < 0) {
    source.m_offset = 0;
  }
  else {
    source.m_offset = (long)i + this->m_offset;
  }
  SVar1.m_stream = this->m_stream;
  SVar1.m_offset = source.m_offset;
  return SVar1;
}

Assistant:

inline const StreamCharSource StreamCharSource::operator+(int i) const {
  StreamCharSource source(*this);
  if (static_cast<int>(source.m_offset) + i >= 0)
    source.m_offset += static_cast<std::size_t>(i);
  else
    source.m_offset = 0;
  return source;
}